

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd128.c
# Opt level: O2

int rmd128_compress(hash_state *md,uchar *buf)

{
  uint uVar1;
  uint uVar2;
  ulong32 uVar3;
  uint uVar4;
  int i;
  long lVar5;
  ulong32 __ROLc_tmp_67;
  ulong32 __ROLc_tmp_3;
  ulong32 __ROLc_tmp_64;
  uint uVar6;
  uint uVar7;
  ulong32 __ROLc_tmp_2;
  uint uVar8;
  uint uVar9;
  ulong32 __ROLc_tmp;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong32 __ROLc_tmp_1;
  uint uVar13;
  uint uVar14;
  ulong32 X [16];
  int local_88 [22];
  
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    local_88[lVar5] = *(int *)(buf + lVar5 * 4);
  }
  uVar1 = (md->rmd128).state[2];
  uVar2 = (md->rmd128).state[1];
  uVar3 = (md->rmd128).state[0];
  uVar4 = (md->rmd128).state[3];
  uVar10 = (uVar1 ^ uVar2 ^ uVar4) + uVar3 + local_88[0];
  uVar11 = uVar10 * 0x800 | uVar10 >> 0x15;
  uVar10 = (uVar1 ^ uVar2 ^ uVar11) + local_88[1] + uVar4;
  uVar13 = uVar10 * 0x4000 | uVar10 >> 0x12;
  uVar10 = (uVar11 ^ uVar2 ^ uVar13) + local_88[2] + uVar1;
  uVar8 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar10 = (uVar13 ^ uVar11 ^ uVar8) + local_88[3] + uVar2;
  uVar10 = uVar10 * 0x1000 | uVar10 >> 0x14;
  uVar11 = uVar11 + local_88[4] + (uVar8 ^ uVar13 ^ uVar10);
  uVar11 = uVar11 * 0x20 | uVar11 >> 0x1b;
  uVar13 = uVar13 + local_88[5] + (uVar10 ^ uVar8 ^ uVar11);
  uVar13 = uVar13 * 0x100 | uVar13 >> 0x18;
  uVar8 = uVar8 + local_88[6] + (uVar11 ^ uVar10 ^ uVar13);
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar10 = uVar10 + local_88[7] + (uVar13 ^ uVar11 ^ uVar8);
  uVar10 = uVar10 * 0x200 | uVar10 >> 0x17;
  uVar11 = uVar11 + local_88[8] + (uVar8 ^ uVar13 ^ uVar10);
  uVar11 = uVar11 * 0x800 | uVar11 >> 0x15;
  uVar13 = uVar13 + local_88[9] + (uVar10 ^ uVar8 ^ uVar11);
  uVar13 = uVar13 * 0x2000 | uVar13 >> 0x13;
  uVar8 = uVar8 + local_88[10] + (uVar11 ^ uVar10 ^ uVar13);
  uVar8 = uVar8 * 0x4000 | uVar8 >> 0x12;
  uVar10 = uVar10 + local_88[0xb] + (uVar13 ^ uVar11 ^ uVar8);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[0xc] + (uVar8 ^ uVar13 ^ uVar10);
  uVar11 = uVar11 * 0x40 | uVar11 >> 0x1a;
  uVar13 = uVar13 + local_88[0xd] + (uVar10 ^ uVar8 ^ uVar11);
  uVar13 = uVar13 * 0x80 | uVar13 >> 0x19;
  uVar8 = uVar8 + local_88[0xe] + (uVar11 ^ uVar10 ^ uVar13);
  uVar8 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar10 = uVar10 + local_88[0xf] + (uVar13 ^ uVar11 ^ uVar8);
  uVar10 = uVar10 * 0x100 | uVar10 >> 0x18;
  uVar11 = uVar11 + local_88[7] + 0x5a827999 + (~uVar10 & uVar13 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x80 | uVar11 >> 0x19;
  uVar13 = uVar13 + local_88[4] + 0x5a827999 + (~uVar11 & uVar8 | uVar11 & uVar10);
  uVar13 = uVar13 * 0x40 | uVar13 >> 0x1a;
  uVar8 = uVar8 + local_88[0xd] + 0x5a827999 + (~uVar13 & uVar10 | uVar13 & uVar11);
  uVar8 = uVar8 * 0x100 | uVar8 >> 0x18;
  uVar10 = uVar10 + local_88[1] + 0x5a827999 + (~uVar8 & uVar11 | uVar8 & uVar13);
  uVar10 = uVar10 * 0x2000 | uVar10 >> 0x13;
  uVar11 = uVar11 + local_88[10] + 0x5a827999 + (~uVar10 & uVar13 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x800 | uVar11 >> 0x15;
  uVar13 = uVar13 + local_88[6] + 0x5a827999 + (~uVar11 & uVar8 | uVar11 & uVar10);
  uVar13 = uVar13 * 0x200 | uVar13 >> 0x17;
  uVar8 = uVar8 + local_88[0xf] + 0x5a827999 + (~uVar13 & uVar10 | uVar13 & uVar11);
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar10 = uVar10 + local_88[3] + 0x5a827999 + (~uVar8 & uVar11 | uVar8 & uVar13);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[0xc] + 0x5a827999 + (~uVar10 & uVar13 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x80 | uVar11 >> 0x19;
  uVar13 = uVar13 + local_88[0] + 0x5a827999 + (~uVar11 & uVar8 | uVar11 & uVar10);
  uVar13 = uVar13 * 0x1000 | uVar13 >> 0x14;
  uVar8 = uVar8 + local_88[9] + 0x5a827999 + (~uVar13 & uVar10 | uVar13 & uVar11);
  uVar8 = uVar8 * 0x8000 | uVar8 >> 0x11;
  uVar10 = uVar10 + local_88[5] + 0x5a827999 + (~uVar8 & uVar11 | uVar8 & uVar13);
  uVar10 = uVar10 * 0x200 | uVar10 >> 0x17;
  uVar11 = uVar11 + local_88[2] + 0x5a827999 + (~uVar10 & uVar13 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x800 | uVar11 >> 0x15;
  uVar13 = uVar13 + local_88[0xe] + 0x5a827999 + (~uVar11 & uVar8 | uVar11 & uVar10);
  uVar13 = uVar13 * 0x80 | uVar13 >> 0x19;
  uVar8 = uVar8 + local_88[0xb] + 0x5a827999 + (~uVar13 & uVar10 | uVar13 & uVar11);
  uVar8 = uVar8 * 0x2000 | uVar8 >> 0x13;
  uVar10 = uVar10 + local_88[8] + 0x5a827999 + (~uVar8 & uVar11 | uVar8 & uVar13);
  uVar10 = uVar10 * 0x1000 | uVar10 >> 0x14;
  uVar11 = uVar11 + local_88[3] + 0x6ed9eba1 + ((~uVar8 | uVar10) ^ uVar13);
  uVar11 = uVar11 * 0x800 | uVar11 >> 0x15;
  uVar13 = uVar13 + local_88[10] + 0x6ed9eba1 + ((~uVar10 | uVar11) ^ uVar8);
  uVar13 = uVar13 * 0x2000 | uVar13 >> 0x13;
  uVar8 = uVar8 + local_88[0xe] + 0x6ed9eba1 + ((~uVar11 | uVar13) ^ uVar10);
  uVar8 = uVar8 * 0x40 | uVar8 >> 0x1a;
  uVar10 = uVar10 + local_88[4] + 0x6ed9eba1 + ((~uVar13 | uVar8) ^ uVar11);
  uVar10 = uVar10 * 0x80 | uVar10 >> 0x19;
  uVar11 = uVar11 + local_88[9] + 0x6ed9eba1 + ((~uVar8 | uVar10) ^ uVar13);
  uVar11 = uVar11 * 0x4000 | uVar11 >> 0x12;
  uVar13 = uVar13 + local_88[0xf] + 0x6ed9eba1 + ((~uVar10 | uVar11) ^ uVar8);
  uVar13 = uVar13 * 0x200 | uVar13 >> 0x17;
  uVar8 = uVar8 + local_88[8] + 0x6ed9eba1 + ((~uVar11 | uVar13) ^ uVar10);
  uVar8 = uVar8 * 0x2000 | uVar8 >> 0x13;
  uVar10 = uVar10 + local_88[1] + 0x6ed9eba1 + ((~uVar13 | uVar8) ^ uVar11);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[2] + 0x6ed9eba1 + ((~uVar8 | uVar10) ^ uVar13);
  uVar11 = uVar11 * 0x4000 | uVar11 >> 0x12;
  uVar13 = uVar13 + local_88[7] + 0x6ed9eba1 + ((~uVar10 | uVar11) ^ uVar8);
  uVar13 = uVar13 * 0x100 | uVar13 >> 0x18;
  uVar8 = uVar8 + local_88[0] + 0x6ed9eba1 + ((~uVar11 | uVar13) ^ uVar10);
  uVar8 = uVar8 * 0x2000 | uVar8 >> 0x13;
  uVar10 = uVar10 + local_88[6] + 0x6ed9eba1 + ((~uVar13 | uVar8) ^ uVar11);
  uVar10 = uVar10 * 0x40 | uVar10 >> 0x1a;
  uVar11 = uVar11 + local_88[0xd] + 0x6ed9eba1 + ((~uVar8 | uVar10) ^ uVar13);
  uVar11 = uVar11 * 0x20 | uVar11 >> 0x1b;
  uVar13 = uVar13 + local_88[0xb] + 0x6ed9eba1 + ((~uVar10 | uVar11) ^ uVar8);
  uVar13 = uVar13 * 0x1000 | uVar13 >> 0x14;
  uVar8 = uVar8 + local_88[5] + 0x6ed9eba1 + ((~uVar11 | uVar13) ^ uVar10);
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar10 = uVar10 + local_88[0xc] + 0x6ed9eba1 + ((~uVar13 | uVar8) ^ uVar11);
  uVar10 = uVar10 * 0x20 | uVar10 >> 0x1b;
  uVar11 = uVar11 + local_88[1] + -0x70e44324 + (~uVar13 & uVar8 | uVar10 & uVar13);
  uVar11 = uVar11 * 0x800 | uVar11 >> 0x15;
  uVar13 = uVar13 + local_88[9] + -0x70e44324 + (~uVar8 & uVar10 | uVar11 & uVar8);
  uVar13 = uVar13 * 0x1000 | uVar13 >> 0x14;
  uVar8 = uVar8 + local_88[0xb] + -0x70e44324 + (~uVar10 & uVar11 | uVar13 & uVar10);
  uVar8 = uVar8 * 0x4000 | uVar8 >> 0x12;
  uVar10 = uVar10 + local_88[10] + -0x70e44324 + (~uVar11 & uVar13 | uVar8 & uVar11);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[0] + -0x70e44324 + (~uVar13 & uVar8 | uVar10 & uVar13);
  uVar11 = uVar11 * 0x4000 | uVar11 >> 0x12;
  uVar13 = uVar13 + local_88[8] + -0x70e44324 + (~uVar8 & uVar10 | uVar11 & uVar8);
  uVar13 = uVar13 * 0x8000 | uVar13 >> 0x11;
  uVar8 = uVar8 + local_88[0xc] + -0x70e44324 + (~uVar10 & uVar11 | uVar13 & uVar10);
  uVar8 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar10 = uVar10 + local_88[4] + -0x70e44324 + (~uVar11 & uVar13 | uVar8 & uVar11);
  uVar10 = uVar10 * 0x100 | uVar10 >> 0x18;
  uVar11 = uVar11 + local_88[0xd] + -0x70e44324 + (~uVar13 & uVar8 | uVar10 & uVar13);
  uVar11 = uVar11 * 0x200 | uVar11 >> 0x17;
  uVar13 = uVar13 + local_88[3] + -0x70e44324 + (~uVar8 & uVar10 | uVar11 & uVar8);
  uVar13 = uVar13 * 0x4000 | uVar13 >> 0x12;
  uVar8 = uVar8 + local_88[7] + -0x70e44324 + (~uVar10 & uVar11 | uVar13 & uVar10);
  uVar8 = uVar8 * 0x20 | uVar8 >> 0x1b;
  uVar10 = uVar10 + local_88[0xf] + -0x70e44324 + (~uVar11 & uVar13 | uVar8 & uVar11);
  uVar10 = uVar10 * 0x40 | uVar10 >> 0x1a;
  uVar11 = uVar11 + local_88[0xe] + -0x70e44324 + (~uVar13 & uVar8 | uVar10 & uVar13);
  uVar12 = uVar11 * 0x100 | uVar11 >> 0x18;
  uVar11 = uVar13 + local_88[5] + -0x70e44324 + (~uVar8 & uVar10 | uVar12 & uVar8);
  uVar14 = uVar11 * 0x40 | uVar11 >> 0x1a;
  uVar8 = uVar8 + local_88[6] + -0x70e44324 + (~uVar10 & uVar12 | uVar14 & uVar10);
  uVar9 = uVar8 * 0x20 | uVar8 >> 0x1b;
  uVar13 = uVar10 + local_88[2] + -0x70e44324 + (~uVar12 & uVar14 | uVar9 & uVar12);
  uVar10 = local_88[5] + uVar3 + 0x50a28be6 + (~uVar4 & uVar1 | uVar4 & uVar2);
  uVar6 = uVar10 * 0x100 | uVar10 >> 0x18;
  uVar10 = uVar4 + local_88[0xe] + 0x50a28be6 + (~uVar1 & uVar2 | uVar6 & uVar1);
  uVar10 = uVar10 * 0x200 | uVar10 >> 0x17;
  uVar8 = uVar1 + local_88[7] + 0x50a28be6 + (~uVar2 & uVar6 | uVar10 & uVar2);
  uVar11 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar8 = local_88[0] + uVar2 + 0x50a28be6 + (~uVar6 & uVar10 | uVar11 & uVar6);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[9] + 0x50a28be6 + (~uVar10 & uVar11 | uVar8 & uVar10);
  uVar6 = uVar6 * 0x2000 | uVar6 >> 0x13;
  uVar10 = uVar10 + local_88[2] + 0x50a28be6 + (~uVar11 & uVar8 | uVar6 & uVar11);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[0xb] + 0x50a28be6 + (~uVar8 & uVar6 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x8000 | uVar11 >> 0x11;
  uVar8 = uVar8 + local_88[4] + 0x50a28be6 + (~uVar6 & uVar10 | uVar11 & uVar6);
  uVar8 = uVar8 * 0x20 | uVar8 >> 0x1b;
  uVar6 = uVar6 + local_88[0xd] + 0x50a28be6 + (~uVar10 & uVar11 | uVar8 & uVar10);
  uVar6 = uVar6 * 0x80 | uVar6 >> 0x19;
  uVar10 = uVar10 + local_88[6] + 0x50a28be6 + (~uVar11 & uVar8 | uVar6 & uVar11);
  uVar10 = uVar10 * 0x80 | uVar10 >> 0x19;
  uVar11 = uVar11 + local_88[0xf] + 0x50a28be6 + (~uVar8 & uVar6 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x100 | uVar11 >> 0x18;
  uVar8 = uVar8 + local_88[8] + 0x50a28be6 + (~uVar6 & uVar10 | uVar11 & uVar6);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[1] + 0x50a28be6 + (~uVar10 & uVar11 | uVar8 & uVar10);
  uVar6 = uVar6 * 0x4000 | uVar6 >> 0x12;
  uVar10 = uVar10 + local_88[10] + 0x50a28be6 + (~uVar11 & uVar8 | uVar6 & uVar11);
  uVar10 = uVar10 * 0x4000 | uVar10 >> 0x12;
  uVar11 = uVar11 + local_88[3] + 0x50a28be6 + (~uVar8 & uVar6 | uVar10 & uVar8);
  uVar11 = uVar11 * 0x1000 | uVar11 >> 0x14;
  uVar8 = uVar8 + local_88[0xc] + 0x50a28be6 + (~uVar6 & uVar10 | uVar11 & uVar6);
  uVar8 = uVar8 * 0x40 | uVar8 >> 0x1a;
  uVar6 = uVar6 + local_88[6] + 0x5c4dd124 + ((~uVar11 | uVar8) ^ uVar10);
  uVar6 = uVar6 * 0x200 | uVar6 >> 0x17;
  uVar10 = uVar10 + local_88[0xb] + 0x5c4dd124 + ((~uVar8 | uVar6) ^ uVar11);
  uVar10 = uVar10 * 0x2000 | uVar10 >> 0x13;
  uVar11 = uVar11 + local_88[3] + 0x5c4dd124 + ((~uVar6 | uVar10) ^ uVar8);
  uVar11 = uVar11 * 0x8000 | uVar11 >> 0x11;
  uVar8 = uVar8 + local_88[7] + 0x5c4dd124 + ((~uVar10 | uVar11) ^ uVar6);
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar6 = uVar6 + local_88[0] + 0x5c4dd124 + ((~uVar11 | uVar8) ^ uVar10);
  uVar6 = uVar6 * 0x1000 | uVar6 >> 0x14;
  uVar10 = uVar10 + local_88[0xd] + 0x5c4dd124 + ((~uVar8 | uVar6) ^ uVar11);
  uVar10 = uVar10 * 0x100 | uVar10 >> 0x18;
  uVar11 = uVar11 + local_88[5] + 0x5c4dd124 + ((~uVar6 | uVar10) ^ uVar8);
  uVar11 = uVar11 * 0x200 | uVar11 >> 0x17;
  uVar8 = uVar8 + local_88[10] + 0x5c4dd124 + ((~uVar10 | uVar11) ^ uVar6);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[0xe] + 0x5c4dd124 + ((~uVar11 | uVar8) ^ uVar10);
  uVar6 = uVar6 * 0x80 | uVar6 >> 0x19;
  uVar10 = uVar10 + local_88[0xf] + 0x5c4dd124 + ((~uVar8 | uVar6) ^ uVar11);
  uVar10 = uVar10 * 0x80 | uVar10 >> 0x19;
  uVar11 = uVar11 + local_88[8] + 0x5c4dd124 + ((~uVar6 | uVar10) ^ uVar8);
  uVar11 = uVar11 * 0x1000 | uVar11 >> 0x14;
  uVar8 = uVar8 + local_88[0xc] + 0x5c4dd124 + ((~uVar10 | uVar11) ^ uVar6);
  uVar8 = uVar8 * 0x80 | uVar8 >> 0x19;
  uVar6 = uVar6 + local_88[4] + 0x5c4dd124 + ((~uVar11 | uVar8) ^ uVar10);
  uVar6 = uVar6 * 0x40 | uVar6 >> 0x1a;
  uVar10 = uVar10 + local_88[9] + 0x5c4dd124 + ((~uVar8 | uVar6) ^ uVar11);
  uVar10 = uVar10 * 0x8000 | uVar10 >> 0x11;
  uVar11 = uVar11 + local_88[1] + 0x5c4dd124 + ((~uVar6 | uVar10) ^ uVar8);
  uVar11 = uVar11 * 0x2000 | uVar11 >> 0x13;
  uVar8 = uVar8 + local_88[2] + 0x5c4dd124 + ((~uVar10 | uVar11) ^ uVar6);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[0xf] + 0x6d703ef3 + (~uVar8 & uVar10 | uVar8 & uVar11);
  uVar6 = uVar6 * 0x200 | uVar6 >> 0x17;
  uVar10 = uVar10 + local_88[5] + 0x6d703ef3 + (~uVar6 & uVar11 | uVar6 & uVar8);
  uVar10 = uVar10 * 0x80 | uVar10 >> 0x19;
  uVar11 = uVar11 + local_88[1] + 0x6d703ef3 + (~uVar10 & uVar8 | uVar10 & uVar6);
  uVar11 = uVar11 * 0x8000 | uVar11 >> 0x11;
  uVar8 = uVar8 + local_88[3] + 0x6d703ef3 + (~uVar11 & uVar6 | uVar11 & uVar10);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[7] + 0x6d703ef3 + (~uVar8 & uVar10 | uVar8 & uVar11);
  uVar6 = uVar6 * 0x100 | uVar6 >> 0x18;
  uVar10 = uVar10 + local_88[0xe] + 0x6d703ef3 + (~uVar6 & uVar11 | uVar6 & uVar8);
  uVar10 = uVar10 * 0x40 | uVar10 >> 0x1a;
  uVar11 = uVar11 + local_88[6] + 0x6d703ef3 + (~uVar10 & uVar8 | uVar10 & uVar6);
  uVar11 = uVar11 * 0x40 | uVar11 >> 0x1a;
  uVar8 = uVar8 + local_88[9] + 0x6d703ef3 + (~uVar11 & uVar6 | uVar11 & uVar10);
  uVar8 = uVar8 * 0x4000 | uVar8 >> 0x12;
  uVar6 = uVar6 + local_88[0xb] + 0x6d703ef3 + (~uVar8 & uVar10 | uVar8 & uVar11);
  uVar6 = uVar6 * 0x1000 | uVar6 >> 0x14;
  uVar10 = uVar10 + local_88[8] + 0x6d703ef3 + (~uVar6 & uVar11 | uVar6 & uVar8);
  uVar10 = uVar10 * 0x2000 | uVar10 >> 0x13;
  uVar11 = uVar11 + local_88[0xc] + 0x6d703ef3 + (~uVar10 & uVar8 | uVar10 & uVar6);
  uVar11 = uVar11 * 0x20 | uVar11 >> 0x1b;
  uVar8 = uVar8 + local_88[2] + 0x6d703ef3 + (~uVar11 & uVar6 | uVar11 & uVar10);
  uVar8 = uVar8 * 0x4000 | uVar8 >> 0x12;
  uVar6 = uVar6 + local_88[10] + 0x6d703ef3 + (~uVar8 & uVar10 | uVar8 & uVar11);
  uVar6 = uVar6 * 0x2000 | uVar6 >> 0x13;
  uVar10 = uVar10 + local_88[0] + 0x6d703ef3 + (~uVar6 & uVar11 | uVar6 & uVar8);
  uVar10 = uVar10 * 0x2000 | uVar10 >> 0x13;
  uVar11 = uVar11 + local_88[4] + 0x6d703ef3 + (~uVar10 & uVar8 | uVar10 & uVar6);
  uVar11 = uVar11 * 0x80 | uVar11 >> 0x19;
  uVar8 = uVar8 + local_88[0xd] + 0x6d703ef3 + (~uVar11 & uVar6 | uVar11 & uVar10);
  uVar8 = uVar8 * 0x20 | uVar8 >> 0x1b;
  uVar6 = uVar6 + local_88[8] + (uVar8 ^ uVar11 ^ uVar10);
  uVar6 = uVar6 * 0x8000 | uVar6 >> 0x11;
  uVar10 = uVar10 + local_88[6] + (uVar8 ^ uVar11 ^ uVar6);
  uVar10 = uVar10 * 0x20 | uVar10 >> 0x1b;
  uVar11 = uVar11 + local_88[4] + (uVar6 ^ uVar8 ^ uVar10);
  uVar11 = uVar11 * 0x100 | uVar11 >> 0x18;
  uVar8 = uVar8 + local_88[1] + (uVar10 ^ uVar6 ^ uVar11);
  uVar8 = uVar8 * 0x800 | uVar8 >> 0x15;
  uVar6 = uVar6 + local_88[3] + (uVar11 ^ uVar10 ^ uVar8);
  uVar6 = uVar6 * 0x4000 | uVar6 >> 0x12;
  uVar10 = uVar10 + local_88[0xb] + (uVar8 ^ uVar11 ^ uVar6);
  uVar10 = uVar10 * 0x4000 | uVar10 >> 0x12;
  uVar11 = uVar11 + local_88[0xf] + (uVar6 ^ uVar8 ^ uVar10);
  uVar11 = uVar11 * 0x40 | uVar11 >> 0x1a;
  uVar8 = uVar8 + local_88[0] + (uVar10 ^ uVar6 ^ uVar11);
  uVar8 = uVar8 * 0x4000 | uVar8 >> 0x12;
  uVar6 = uVar6 + local_88[5] + (uVar11 ^ uVar10 ^ uVar8);
  uVar7 = uVar6 * 0x40 | uVar6 >> 0x1a;
  uVar10 = uVar10 + local_88[0xc] + (uVar8 ^ uVar11 ^ uVar7);
  uVar10 = uVar10 * 0x200 | uVar10 >> 0x17;
  uVar11 = uVar11 + local_88[2] + (uVar7 ^ uVar8 ^ uVar10);
  uVar6 = uVar11 * 0x1000 | uVar11 >> 0x14;
  uVar8 = uVar8 + local_88[0xd] + (uVar10 ^ uVar7 ^ uVar6);
  uVar11 = uVar8 * 0x200 | uVar8 >> 0x17;
  uVar8 = uVar7 + local_88[9] + (uVar6 ^ uVar10 ^ uVar11);
  uVar7 = uVar8 * 0x1000 | uVar8 >> 0x14;
  uVar10 = uVar10 + local_88[7] + (uVar11 ^ uVar6 ^ uVar7);
  uVar10 = uVar10 * 0x20 | uVar10 >> 0x1b;
  uVar8 = uVar6 + local_88[10] + (uVar7 ^ uVar11 ^ uVar10);
  uVar6 = uVar8 * 0x8000 | uVar8 >> 0x11;
  uVar8 = uVar10 ^ uVar7 ^ uVar6;
  uVar11 = uVar11 + local_88[0xe] + uVar8;
  (md->rmd128).state[1] = uVar7 + uVar1 + uVar14;
  (md->rmd128).state[2] = uVar12 + uVar4 + (uVar11 * 0x100 | uVar11 >> 0x18);
  (md->rmd128).state[3] = uVar6 + uVar3 + (uVar13 * 0x1000 | uVar13 >> 0x14);
  (md->rmd128).state[0] = uVar2 + uVar10 + uVar9;
  return uVar8;
}

Assistant:

static int  rmd128_compress(hash_state *md, unsigned char *buf)
#endif
{
   ulong32 aa,bb,cc,dd,aaa,bbb,ccc,ddd,X[16];
   int i;

   /* load words X */
   for (i = 0; i < 16; i++){
      LOAD32L(X[i], buf + (4 * i));
   }

   /* load state */
   aa = aaa = md->rmd128.state[0];
   bb = bbb = md->rmd128.state[1];
   cc = ccc = md->rmd128.state[2];
   dd = ddd = md->rmd128.state[3];

   /* round 1 */
   FF(aa, bb, cc, dd, X[ 0], 11);
   FF(dd, aa, bb, cc, X[ 1], 14);
   FF(cc, dd, aa, bb, X[ 2], 15);
   FF(bb, cc, dd, aa, X[ 3], 12);
   FF(aa, bb, cc, dd, X[ 4],  5);
   FF(dd, aa, bb, cc, X[ 5],  8);
   FF(cc, dd, aa, bb, X[ 6],  7);
   FF(bb, cc, dd, aa, X[ 7],  9);
   FF(aa, bb, cc, dd, X[ 8], 11);
   FF(dd, aa, bb, cc, X[ 9], 13);
   FF(cc, dd, aa, bb, X[10], 14);
   FF(bb, cc, dd, aa, X[11], 15);
   FF(aa, bb, cc, dd, X[12],  6);
   FF(dd, aa, bb, cc, X[13],  7);
   FF(cc, dd, aa, bb, X[14],  9);
   FF(bb, cc, dd, aa, X[15],  8);

   /* round 2 */
   GG(aa, bb, cc, dd, X[ 7],  7);
   GG(dd, aa, bb, cc, X[ 4],  6);
   GG(cc, dd, aa, bb, X[13],  8);
   GG(bb, cc, dd, aa, X[ 1], 13);
   GG(aa, bb, cc, dd, X[10], 11);
   GG(dd, aa, bb, cc, X[ 6],  9);
   GG(cc, dd, aa, bb, X[15],  7);
   GG(bb, cc, dd, aa, X[ 3], 15);
   GG(aa, bb, cc, dd, X[12],  7);
   GG(dd, aa, bb, cc, X[ 0], 12);
   GG(cc, dd, aa, bb, X[ 9], 15);
   GG(bb, cc, dd, aa, X[ 5],  9);
   GG(aa, bb, cc, dd, X[ 2], 11);
   GG(dd, aa, bb, cc, X[14],  7);
   GG(cc, dd, aa, bb, X[11], 13);
   GG(bb, cc, dd, aa, X[ 8], 12);

   /* round 3 */
   HH(aa, bb, cc, dd, X[ 3], 11);
   HH(dd, aa, bb, cc, X[10], 13);
   HH(cc, dd, aa, bb, X[14],  6);
   HH(bb, cc, dd, aa, X[ 4],  7);
   HH(aa, bb, cc, dd, X[ 9], 14);
   HH(dd, aa, bb, cc, X[15],  9);
   HH(cc, dd, aa, bb, X[ 8], 13);
   HH(bb, cc, dd, aa, X[ 1], 15);
   HH(aa, bb, cc, dd, X[ 2], 14);
   HH(dd, aa, bb, cc, X[ 7],  8);
   HH(cc, dd, aa, bb, X[ 0], 13);
   HH(bb, cc, dd, aa, X[ 6],  6);
   HH(aa, bb, cc, dd, X[13],  5);
   HH(dd, aa, bb, cc, X[11], 12);
   HH(cc, dd, aa, bb, X[ 5],  7);
   HH(bb, cc, dd, aa, X[12],  5);

   /* round 4 */
   II(aa, bb, cc, dd, X[ 1], 11);
   II(dd, aa, bb, cc, X[ 9], 12);
   II(cc, dd, aa, bb, X[11], 14);
   II(bb, cc, dd, aa, X[10], 15);
   II(aa, bb, cc, dd, X[ 0], 14);
   II(dd, aa, bb, cc, X[ 8], 15);
   II(cc, dd, aa, bb, X[12],  9);
   II(bb, cc, dd, aa, X[ 4],  8);
   II(aa, bb, cc, dd, X[13],  9);
   II(dd, aa, bb, cc, X[ 3], 14);
   II(cc, dd, aa, bb, X[ 7],  5);
   II(bb, cc, dd, aa, X[15],  6);
   II(aa, bb, cc, dd, X[14],  8);
   II(dd, aa, bb, cc, X[ 5],  6);
   II(cc, dd, aa, bb, X[ 6],  5);
   II(bb, cc, dd, aa, X[ 2], 12);

   /* parallel round 1 */
   III(aaa, bbb, ccc, ddd, X[ 5],  8);
   III(ddd, aaa, bbb, ccc, X[14],  9);
   III(ccc, ddd, aaa, bbb, X[ 7],  9);
   III(bbb, ccc, ddd, aaa, X[ 0], 11);
   III(aaa, bbb, ccc, ddd, X[ 9], 13);
   III(ddd, aaa, bbb, ccc, X[ 2], 15);
   III(ccc, ddd, aaa, bbb, X[11], 15);
   III(bbb, ccc, ddd, aaa, X[ 4],  5);
   III(aaa, bbb, ccc, ddd, X[13],  7);
   III(ddd, aaa, bbb, ccc, X[ 6],  7);
   III(ccc, ddd, aaa, bbb, X[15],  8);
   III(bbb, ccc, ddd, aaa, X[ 8], 11);
   III(aaa, bbb, ccc, ddd, X[ 1], 14);
   III(ddd, aaa, bbb, ccc, X[10], 14);
   III(ccc, ddd, aaa, bbb, X[ 3], 12);
   III(bbb, ccc, ddd, aaa, X[12],  6);

   /* parallel round 2 */
   HHH(aaa, bbb, ccc, ddd, X[ 6],  9);
   HHH(ddd, aaa, bbb, ccc, X[11], 13);
   HHH(ccc, ddd, aaa, bbb, X[ 3], 15);
   HHH(bbb, ccc, ddd, aaa, X[ 7],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 0], 12);
   HHH(ddd, aaa, bbb, ccc, X[13],  8);
   HHH(ccc, ddd, aaa, bbb, X[ 5],  9);
   HHH(bbb, ccc, ddd, aaa, X[10], 11);
   HHH(aaa, bbb, ccc, ddd, X[14],  7);
   HHH(ddd, aaa, bbb, ccc, X[15],  7);
   HHH(ccc, ddd, aaa, bbb, X[ 8], 12);
   HHH(bbb, ccc, ddd, aaa, X[12],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 4],  6);
   HHH(ddd, aaa, bbb, ccc, X[ 9], 15);
   HHH(ccc, ddd, aaa, bbb, X[ 1], 13);
   HHH(bbb, ccc, ddd, aaa, X[ 2], 11);

   /* parallel round 3 */
   GGG(aaa, bbb, ccc, ddd, X[15],  9);
   GGG(ddd, aaa, bbb, ccc, X[ 5],  7);
   GGG(ccc, ddd, aaa, bbb, X[ 1], 15);
   GGG(bbb, ccc, ddd, aaa, X[ 3], 11);
   GGG(aaa, bbb, ccc, ddd, X[ 7],  8);
   GGG(ddd, aaa, bbb, ccc, X[14],  6);
   GGG(ccc, ddd, aaa, bbb, X[ 6],  6);
   GGG(bbb, ccc, ddd, aaa, X[ 9], 14);
   GGG(aaa, bbb, ccc, ddd, X[11], 12);
   GGG(ddd, aaa, bbb, ccc, X[ 8], 13);
   GGG(ccc, ddd, aaa, bbb, X[12],  5);
   GGG(bbb, ccc, ddd, aaa, X[ 2], 14);
   GGG(aaa, bbb, ccc, ddd, X[10], 13);
   GGG(ddd, aaa, bbb, ccc, X[ 0], 13);
   GGG(ccc, ddd, aaa, bbb, X[ 4],  7);
   GGG(bbb, ccc, ddd, aaa, X[13],  5);

   /* parallel round 4 */
   FFF(aaa, bbb, ccc, ddd, X[ 8], 15);
   FFF(ddd, aaa, bbb, ccc, X[ 6],  5);
   FFF(ccc, ddd, aaa, bbb, X[ 4],  8);
   FFF(bbb, ccc, ddd, aaa, X[ 1], 11);
   FFF(aaa, bbb, ccc, ddd, X[ 3], 14);
   FFF(ddd, aaa, bbb, ccc, X[11], 14);
   FFF(ccc, ddd, aaa, bbb, X[15],  6);
   FFF(bbb, ccc, ddd, aaa, X[ 0], 14);
   FFF(aaa, bbb, ccc, ddd, X[ 5],  6);
   FFF(ddd, aaa, bbb, ccc, X[12],  9);
   FFF(ccc, ddd, aaa, bbb, X[ 2], 12);
   FFF(bbb, ccc, ddd, aaa, X[13],  9);
   FFF(aaa, bbb, ccc, ddd, X[ 9], 12);
   FFF(ddd, aaa, bbb, ccc, X[ 7],  5);
   FFF(ccc, ddd, aaa, bbb, X[10], 15);
   FFF(bbb, ccc, ddd, aaa, X[14],  8);

   /* combine results */
   ddd += cc + md->rmd128.state[1];               /* final result for MDbuf[0] */
   md->rmd128.state[1] = md->rmd128.state[2] + dd + aaa;
   md->rmd128.state[2] = md->rmd128.state[3] + aa + bbb;
   md->rmd128.state[3] = md->rmd128.state[0] + bb + ccc;
   md->rmd128.state[0] = ddd;

   return CRYPT_OK;
}